

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# count.cpp
# Opt level: O1

void duckdb::CountFunction::CountUpdate
               (Vector *inputs,AggregateInputData *param_2,idx_t input_count,data_ptr_t state_p,
               idx_t count)

{
  VectorType VVar1;
  unsigned_long *puVar2;
  sel_t *psVar3;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  unsigned_long uVar9;
  ulong uVar10;
  UnifiedVectorFormat idata;
  UnifiedVectorFormat local_68;
  
  VVar1 = inputs->vector_type;
  if (VVar1 == FLAT_VECTOR) {
    FlatVector::VerifyFlatVector(inputs);
    if (count + 0x3f < 0x40) {
      return;
    }
    lVar4 = *(long *)state_p;
    puVar2 = (inputs->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
    uVar5 = 0;
    uVar6 = 0;
    do {
      if (puVar2 == (unsigned_long *)0x0) {
        uVar9 = 0xffffffffffffffff;
      }
      else {
        uVar9 = puVar2[uVar5];
      }
      uVar7 = uVar6 + 0x40;
      if (count <= uVar6 + 0x40) {
        uVar7 = count;
      }
      uVar8 = uVar7;
      if (uVar9 == 0xffffffffffffffff) {
        lVar4 = lVar4 + (uVar7 - uVar6);
        *(long *)state_p = lVar4;
      }
      else if ((uVar9 != 0) && (uVar8 = uVar6, uVar6 < uVar7)) {
        uVar10 = 0;
        do {
          if ((uVar9 >> (uVar10 & 0x3f) & 1) != 0) {
            lVar4 = lVar4 + 1;
            *(long *)state_p = lVar4;
          }
          uVar10 = uVar10 + 1;
          uVar8 = uVar7;
        } while (uVar7 - uVar6 != uVar10);
      }
      uVar5 = uVar5 + 1;
      uVar6 = uVar8;
    } while (uVar5 != count + 0x3f >> 6);
    return;
  }
  if (VVar1 != SEQUENCE_VECTOR) {
    if (VVar1 != CONSTANT_VECTOR) {
      UnifiedVectorFormat::UnifiedVectorFormat(&local_68);
      Vector::ToUnifiedFormat(inputs,count,&local_68);
      if (local_68.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
          (unsigned_long *)0x0) {
        *(idx_t *)state_p = *(long *)state_p + count;
      }
      else if (count != 0) {
        lVar4 = *(long *)state_p;
        psVar3 = (local_68.sel)->sel_vector;
        uVar6 = 0;
        do {
          uVar5 = uVar6;
          if (psVar3 != (sel_t *)0x0) {
            uVar5 = (ulong)psVar3[uVar6];
          }
          if ((local_68.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
               [uVar5 >> 6] >> (uVar5 & 0x3f) & 1) != 0) {
            lVar4 = lVar4 + 1;
            *(long *)state_p = lVar4;
          }
          uVar6 = uVar6 + 1;
        } while (count != uVar6);
      }
      if (local_68.owned_sel.selection_data.internal.
          super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_68.owned_sel.selection_data.internal.
                   super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                   ._M_pi);
      }
      if (local_68.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        return;
      }
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_68.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal
                 .
                 super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
      return;
    }
    puVar2 = (inputs->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
    if ((puVar2 != (unsigned_long *)0x0) && ((*puVar2 & 1) == 0)) {
      return;
    }
  }
  *(idx_t *)state_p = *(long *)state_p + count;
  return;
}

Assistant:

static void CountUpdate(Vector inputs[], AggregateInputData &, idx_t input_count, data_ptr_t state_p, idx_t count) {
		auto &input = inputs[0];
		auto &result = *reinterpret_cast<STATE *>(state_p);
		switch (input.GetVectorType()) {
		case VectorType::CONSTANT_VECTOR: {
			if (!ConstantVector::IsNull(input)) {
				// if the constant is not null increment the state
				result += UnsafeNumericCast<STATE>(count);
			}
			break;
		}
		case VectorType::FLAT_VECTOR: {
			CountFlatUpdateLoop(result, FlatVector::Validity(input), count);
			break;
		}
		case VectorType::SEQUENCE_VECTOR: {
			// sequence vectors cannot have NULL values
			result += UnsafeNumericCast<STATE>(count);
			break;
		}
		default: {
			UnifiedVectorFormat idata;
			input.ToUnifiedFormat(count, idata);
			CountUpdateLoop(result, idata.validity, count, *idata.sel);
			break;
		}
		}
	}